

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.cpp
# Opt level: O2

void __thiscall Trace::TraceToLog(Trace *this,char *inFormat,__va_list_tag *inList)

{
  IByteWriter *inLogStream;
  Log *pLVar1;
  allocator<char> local_49;
  string local_48;
  
  if (this->mShouldLog == true) {
    if (this->mLog == (Log *)0x0) {
      inLogStream = this->mLogStream;
      pLVar1 = (Log *)operator_new(0x60);
      if (inLogStream == (IByteWriter *)0x0) {
        Log::Log(pLVar1,&this->mLogFilePath,this->mPlaceUTF8Bom);
      }
      else {
        Log::Log(pLVar1,inLogStream);
      }
      this->mLog = pLVar1;
    }
    vsprintf(this->mBuffer,inFormat,inList);
    pLVar1 = this->mLog;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,this->mBuffer,&local_49);
    Log::LogEntry(pLVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void Trace::TraceToLog(const char* inFormat,va_list inList)
{
	if(mShouldLog)
	{
		if(NULL == mLog)
		{
			if(mLogStream)
				mLog = new Log(mLogStream);
			else
				mLog = new Log(mLogFilePath,mPlaceUTF8Bom);
		}

		SAFE_VSPRINTF(mBuffer, MAX_TRACE_SIZE,inFormat,inList);

		mLog->LogEntry(std::string(mBuffer));
	}

}